

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization_classes.h
# Opt level: O2

void cppcms::serialization_traits<mydata,_void>::save
               (serializable_base *real_object,string *serialized_object)

{
  archive a;
  archive local_70 [56];
  string local_38 [32];
  
  cppcms::archive::archive(local_70);
  (*real_object->_vptr_serializable_base[1])(real_object,local_70);
  cppcms::archive::str_abi_cxx11_();
  std::__cxx11::string::operator=((string *)serialized_object,local_38);
  std::__cxx11::string::~string(local_38);
  cppcms::archive::~archive(local_70);
  return;
}

Assistant:

static void save(serializable_base const &real_object,std::string &serialized_object)
		{
			archive a;
			real_object.save(a);
			serialized_object = a.str();
		}